

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O1

void __thiscall
cmGlobalNinjaGenerator::WriteMacOSXContentBuild
          (cmGlobalNinjaGenerator *this,string *input,string *output,string *config)

{
  int iVar1;
  undefined4 extraout_var;
  cmNinjaBuild build;
  char *local_170;
  size_type local_168;
  char local_160 [8];
  undefined8 uStack_158;
  undefined1 local_150 [136];
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> local_c8 [80];
  _Rb_tree_node_base local_78;
  size_t local_58;
  _Alloc_hider local_50;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  AddMacOSXContentRule(this);
  local_170 = local_160;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"COPY_OSX_CONTENT","");
  local_150._0_8_ = local_150 + 0x10;
  local_150._8_8_ = 0;
  local_150[0x10] = '\0';
  local_150._32_8_ = local_150 + 0x30;
  if (local_170 == local_160) {
    local_150._56_8_ = uStack_158;
  }
  else {
    local_150._32_8_ = local_170;
  }
  local_150._40_8_ = local_168;
  local_168 = 0;
  local_160[0] = '\0';
  local_78._M_color = _S_red;
  local_78._M_parent = (_Base_ptr)0x0;
  local_170 = local_160;
  memset((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)(local_150 + 0x40),0,
         0x90);
  local_58 = 0;
  local_50._M_p = (pointer)&local_40;
  local_48 = 0;
  local_40._M_local_buf[0] = '\0';
  local_78._M_left = &local_78;
  local_78._M_right = &local_78;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)(local_150 + 0x40)
             ,output);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>(local_c8,input);
  iVar1 = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator
            [0x41])(this,config);
  WriteBuild(this,(ostream *)CONCAT44(extraout_var,iVar1),(cmNinjaBuild *)local_150,0,(bool *)0x0);
  cmNinjaBuild::~cmNinjaBuild((cmNinjaBuild *)local_150);
  return;
}

Assistant:

void cmGlobalNinjaGenerator::WriteMacOSXContentBuild(std::string input,
                                                     std::string output,
                                                     const std::string& config)
{
  this->AddMacOSXContentRule();
  {
    cmNinjaBuild build("COPY_OSX_CONTENT");
    build.Outputs.push_back(std::move(output));
    build.ExplicitDeps.push_back(std::move(input));
    this->WriteBuild(*this->GetImplFileStream(config), build);
  }
}